

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_cluster_ping(intptr_t uuid,fio_protocol_s *pr_)

{
  uintptr_t *puVar1;
  fio_str_info_s ch;
  fio_write_args_s options;
  fio_str_info_s data;
  fio_msg_internal_s *ptr;
  size_t sVar2;
  fio_msg_internal_s *local_b8;
  code *pcStack_b0;
  size_t local_a8;
  char *pcStack_a0;
  ulong local_98;
  size_t sStack_90;
  char *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  ch.data = (char *)0x0;
  ch.capa = 0;
  ch.len = 0;
  data.data = (char *)0x0;
  data.capa = 0;
  data.len = 0;
  ptr = fio_msg_internal_create(0,10,ch,data,'\0','\x01');
  LOCK();
  ptr->ref = ptr->ref + 1;
  UNLOCK();
  pcStack_b0 = fio_msg_internal_free2;
  local_a8 = (ptr->data).len + 0x12 + (ptr->channel).len;
  pcStack_a0 = (char *)(ptr->meta_len * 0x18 + 0x48);
  local_98 = local_98 & 0xfffffffffffffff0;
  options.after.dealloc = fio_msg_internal_free2;
  options.data.buffer = ptr;
  options.length = local_a8;
  options.offset = (uintptr_t)pcStack_a0;
  options._32_8_ = local_98;
  local_b8 = ptr;
  fio_write2_fn(uuid,options);
  LOCK();
  puVar1 = &ptr->ref;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (*puVar1 == 0) {
    sVar2 = ptr->meta_len;
    if (sVar2 != 0) {
      do {
        ptr->meta_len = sVar2 - 1;
        if (*(long *)(&ptr->filter + sVar2 * 6) != 0) {
          local_b8 = (fio_msg_internal_s *)((ulong)local_b8 & 0xffffffff00000000);
          pcStack_a0 = (ptr->channel).data;
          pcStack_b0 = (code *)(ptr->channel).capa;
          local_a8 = (ptr->channel).len;
          local_88 = (ptr->data).data;
          local_98 = (ptr->data).capa;
          sStack_90 = (ptr->data).len;
          local_80 = 0;
          uStack_78 = 0;
          local_70 = 0;
          (**(code **)(&ptr->filter + sVar2 * 6))(&local_b8,(&ptr->meta_len)[sVar2 * 3]);
        }
        sVar2 = ptr->meta_len;
      } while (sVar2 != 0);
    }
    fio_free(ptr);
  }
  return;
}

Assistant:

static void fio_cluster_ping(intptr_t uuid, fio_protocol_s *pr_) {
  fio_msg_internal_s *m = fio_msg_internal_create(
      0, FIO_CLUSTER_MSG_PING, (fio_str_info_s){.len = 0},
      (fio_str_info_s){.len = 0}, 0, 1);
  fio_msg_internal_send_dup(uuid, m);
  fio_msg_internal_free(m);
  (void)pr_;
}